

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O1

Result<wasm::Ok> *
wasm::WATParser::makeSIMDLoadStoreLane<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,SIMDLoadStoreLaneOp op,int bytes)

{
  Lexer *pLVar1;
  undefined8 *puVar2;
  optional<unsigned_char> oVar3;
  optional<unsigned_int> oVar4;
  Memarg *mem_00;
  uint32_t align;
  _Storage<unsigned_int,_true> _Var5;
  Memarg *__rhs;
  optional<unsigned_long> oVar6;
  undefined1 local_130 [8];
  MaybeResult<wasm::Name> mem;
  Result<wasm::WATParser::Memarg> arg;
  size_t reset;
  anon_class_48_6_2b818c79 retry;
  Result<wasm::WATParser::Memarg> _val;
  undefined8 local_78;
  undefined1 local_70;
  undefined7 uStack_6f;
  undefined8 uStack_68;
  _Storage<unsigned_long,_true> local_60;
  Result<wasm::Ok> *local_58;
  Lexer *local_50;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *local_48;
  Index local_3c;
  SIMDLoadStoreLaneOp local_38;
  Index pos_local;
  SIMDLoadStoreLaneOp op_local;
  int bytes_local;
  
  retry.bytes = (int *)&local_3c;
  retry.annotations =
       (vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *)
       &local_38;
  retry.reset = (size_t *)&pos_local;
  arg.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
  super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
  super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
  super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
  super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
  super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._32_8_ = (ctx->in).pos;
  retry.ctx = (ParseDefsCtx *)
              ((long)&arg.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
                      super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                      super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                      super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err> + 0x20);
  reset = (size_t)ctx;
  retry.pos = (Index *)annotations;
  local_3c = pos;
  local_38 = op;
  pos_local = bytes;
  maybeMemidx<wasm::WATParser::ParseDefsCtx>((MaybeResult<wasm::Name> *)local_130,ctx);
  _Var5 = (_Storage<unsigned_int,_true>)pos_local;
  if (mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02') {
    makeSIMDLoadStoreLane<wasm::WATParser::ParseDefsCtx>::anon_class_48_6_2b818c79::operator()
              (__return_storage_ptr__,(anon_class_48_6_2b818c79 *)&reset);
  }
  else {
    pLVar1 = &ctx->in;
    local_58 = __return_storage_ptr__;
    local_48 = annotations;
    oVar6 = Lexer::takeOffset(pLVar1);
    local_60._M_value =
         oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    oVar4 = Lexer::takeAlign(pLVar1);
    mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._32_8_ = 0;
    if (((undefined1  [16])
         oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) !=
        (undefined1  [16])0x0) {
      mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._32_8_ = local_60;
    }
    if (((ulong)oVar4.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int> >> 0x20 & 1) != 0) {
      _Var5._M_value =
           oVar4.super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>._M_payload;
    }
    __rhs = (Memarg *)
            ((long)&mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                    super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20);
    arg.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
    super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
    super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
    super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
    super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
    super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._M_u._24_1_ = 0;
    arg.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
    super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
    super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
    super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
    super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
    super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._M_u._M_first._M_storage.offset
    ._0_4_ = _Var5;
    local_50 = pLVar1;
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::WATParser::Memarg,_wasm::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::Memarg,_wasm::Err> *)&retry.op,
                    (_Copy_ctor_base<false,_wasm::WATParser::Memarg,_wasm::Err> *)__rhs);
    pLVar1 = local_50;
    __return_storage_ptr__ = local_58;
    if (_val.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._M_u._24_1_ == '\x01') {
      _val.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._32_8_ = &local_70;
      std::__cxx11::string::_M_construct<char*>
                ((string *)
                 ((long)&_val.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err> + 0x20),retry.op
                 ,_val.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._M_u._M_first.
                  _M_storage.offset + (long)retry.op);
      puVar2 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar2;
      if ((undefined1 *)
          _val.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._32_8_ == &local_70) {
        *puVar2 = CONCAT71(uStack_6f,local_70);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_68;
      }
      else {
        *(undefined8 *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
             _val.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
             super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
             super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
             super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
             super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
             super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._32_8_;
        *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
             CONCAT71(uStack_6f,local_70);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_78;
      local_70 = 0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
      _val.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._32_8_ = &local_70;
      std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Memarg,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Memarg,_wasm::Err> *)&retry.op);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Memarg,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Memarg,_wasm::Err> *)&retry.op);
      oVar3 = Lexer::takeU<unsigned_char>(pLVar1);
      if (((ushort)oVar3.super__Optional_base<unsigned_char,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_char> >> 8 & 1) == 0) {
        makeSIMDLoadStoreLane<wasm::WATParser::ParseDefsCtx>::anon_class_48_6_2b818c79::operator()
                  (__return_storage_ptr__,(anon_class_48_6_2b818c79 *)&reset);
      }
      else {
        mem_00 = (Memarg *)local_130;
        if (mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._24_1_ != '\0') {
          mem_00 = (Memarg *)0x0;
        }
        if (arg.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._M_u._24_1_ != '\0') {
          __rhs = (Memarg *)0x0;
        }
        ParseDefsCtx::makeSIMDLoadStoreLane
                  (__return_storage_ptr__,ctx,local_3c,local_48,local_38,(Name *)mem_00,*__rhs,
                   oVar3.super__Optional_base<unsigned_char,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_char>._M_payload);
      }
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Memarg,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Memarg,_wasm::Err> *)
                      ((long)&mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20));
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_130);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeSIMDLoadStoreLane(Ctx& ctx,
                               Index pos,
                               const std::vector<Annotation>& annotations,
                               SIMDLoadStoreLaneOp op,
                               int bytes) {
  auto reset = ctx.in.getPos();

  auto retry = [&]() -> Result<> {
    // We failed to parse. Maybe the lane index was accidentally parsed as the
    // optional memory index. Try again without parsing a memory index.
    WithPosition with(ctx, reset);
    auto arg = memarg(ctx, bytes);
    CHECK_ERR(arg);
    auto lane = ctx.in.takeU8();
    if (!lane) {
      return ctx.in.err("expected lane index");
    }
    return ctx.makeSIMDLoadStoreLane(
      pos, annotations, op, nullptr, *arg, *lane);
  };

  auto mem = maybeMemidx(ctx);
  if (mem.getErr()) {
    return retry();
  }
  auto arg = memarg(ctx, bytes);
  CHECK_ERR(arg);
  auto lane = ctx.in.takeU8();
  if (!lane) {
    return retry();
  }
  return ctx.makeSIMDLoadStoreLane(
    pos, annotations, op, mem.getPtr(), *arg, *lane);
}